

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

LY_ERR lyxml_close_element(lyxml_ctx *xmlctx,char *prefix,size_t prefix_len,char *name,
                          size_t name_len,ly_bool empty)

{
  lyd_node *plVar1;
  long lVar2;
  long lVar3;
  ly_ctx *ctx;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  char *local_b8;
  char *local_88;
  lyxml_elem *e;
  ly_bool empty_local;
  size_t name_len_local;
  char *name_local;
  size_t prefix_len_local;
  char *prefix_local;
  lyxml_ctx *xmlctx_local;
  
  if ((xmlctx->elements).count == 0) {
    ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,"Stray closing element tag (\"%.*s\").",
            name_len & 0xffffffff,name);
    xmlctx_local._4_4_ = LY_EVALID;
  }
  else {
    plVar1 = (xmlctx->elements).field_2.dnodes[(xmlctx->elements).count - 1];
    if ((((plVar1->parent == (lyd_node_inner *)prefix_len) && (plVar1->next == (lyd_node *)name_len)
         ) && ((prefix_len == 0 ||
               (iVar4 = strncmp(prefix,*(char **)plVar1,(size_t)plVar1->parent), iVar4 == 0)))) &&
       (iVar4 = strncmp(name,(char *)plVar1->schema,(size_t)plVar1->next), iVar4 == 0)) {
      ly_set_rm_index(&xmlctx->elements,(xmlctx->elements).count - 1,free);
      lyxml_ns_rm(xmlctx);
      while( true ) {
        bVar8 = true;
        if (((*xmlctx->in->current != ' ') && (bVar8 = true, *xmlctx->in->current != '\t')) &&
           (bVar8 = true, *xmlctx->in->current != '\n')) {
          bVar8 = *xmlctx->in->current == '\r';
        }
        if (!bVar8) break;
        if (*xmlctx->in->current == '\n') {
          xmlctx->in->line = xmlctx->in->line + 1;
        }
        ly_in_skip(xmlctx->in,1);
      }
      if (((empty == '\0') || (*xmlctx->in->current != '/')) ||
         (ly_in_skip(xmlctx->in,1), *xmlctx->in->current != '\0')) {
        if (*xmlctx->in->current == '>') {
          ly_in_skip(xmlctx->in,1);
          xmlctx_local._4_4_ = LY_SUCCESS;
        }
        else {
          ctx = xmlctx->ctx;
          uVar5 = LY_VCODE_INSTREXP_len(xmlctx->in->current);
          ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX,"Invalid character sequence \"%.*s\", expected %s.",
                  (ulong)uVar5,xmlctx->in->current,"element tag termination (\'>\')");
          xmlctx_local._4_4_ = LY_EVALID;
        }
      }
      else {
        ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,"Unexpected end-of-input.");
        xmlctx_local._4_4_ = LY_EVALID;
      }
    }
    else {
      lVar2._0_4_ = plVar1->hash;
      lVar2._4_4_ = plVar1->flags;
      if (lVar2 == 0) {
        local_88 = "";
      }
      else {
        local_88 = *(char **)plVar1;
      }
      lVar3._0_4_ = plVar1->hash;
      lVar3._4_4_ = plVar1->flags;
      pcVar6 = "";
      if (lVar3 != 0) {
        pcVar6 = ":";
      }
      local_b8 = prefix;
      if (prefix == (char *)0x0) {
        local_b8 = "";
      }
      pcVar7 = "";
      if (prefix != (char *)0x0) {
        pcVar7 = ":";
      }
      ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,
              "Opening (\"%.*s%s%.*s\") and closing (\"%.*s%s%.*s\") elements tag mismatch.",
              (ulong)plVar1->parent & 0xffffffff,local_88,pcVar6,(int)plVar1->next,plVar1->schema,
              (int)prefix_len,local_b8,pcVar7,(int)name_len,name);
      xmlctx_local._4_4_ = LY_EVALID;
    }
  }
  return xmlctx_local._4_4_;
}

Assistant:

static LY_ERR
lyxml_close_element(struct lyxml_ctx *xmlctx, const char *prefix, size_t prefix_len, const char *name, size_t name_len,
        ly_bool empty)
{
    struct lyxml_elem *e;

    /* match opening and closing element tags */
    if (!xmlctx->elements.count) {
        LOGVAL(xmlctx->ctx, LYVE_SYNTAX, "Stray closing element tag (\"%.*s\").",
                (int)name_len, name);
        return LY_EVALID;
    }

    e = (struct lyxml_elem *)xmlctx->elements.objs[xmlctx->elements.count - 1];
    if ((e->prefix_len != prefix_len) || (e->name_len != name_len) ||
            (prefix_len && strncmp(prefix, e->prefix, e->prefix_len)) || strncmp(name, e->name, e->name_len)) {
        LOGVAL(xmlctx->ctx, LYVE_SYNTAX, "Opening (\"%.*s%s%.*s\") and closing (\"%.*s%s%.*s\") elements tag mismatch.",
                (int)e->prefix_len, e->prefix ? e->prefix : "", e->prefix ? ":" : "", (int)e->name_len, e->name,
                (int)prefix_len, prefix ? prefix : "", prefix ? ":" : "", (int)name_len, name);
        return LY_EVALID;
    }

    /* opening and closing element tags matches, remove record from the opening tags list */
    ly_set_rm_index(&xmlctx->elements, xmlctx->elements.count - 1, free);

    /* remove also the namespaces connected with the element */
    lyxml_ns_rm(xmlctx);

    /* skip WS */
    ign_xmlws(xmlctx);

    /* special "<elem/>" element */
    if (empty && (xmlctx->in->current[0] == '/')) {
        move_input(xmlctx, 1);
    }

    /* parse closing tag */
    if (xmlctx->in->current[0] != '>') {
        LOGVAL(xmlctx->ctx, LY_VCODE_INSTREXP, LY_VCODE_INSTREXP_len(xmlctx->in->current),
                xmlctx->in->current, "element tag termination ('>')");
        return LY_EVALID;
    }

    /* move after closing tag without checking for EOF */
    ly_in_skip(xmlctx->in, 1);

    return LY_SUCCESS;
}